

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

char * read_body(BinarySource *src)

{
  uchar uVar1;
  strbuf *buf_o;
  char *pcVar2;
  int c;
  strbuf *buf;
  BinarySource *src_local;
  
  buf_o = strbuf_new_nm();
  while (((uVar1 = BinarySource_get_byte(src->binarysource_), uVar1 != '\r' && (uVar1 != '\n')) &&
         (src->binarysource_->err == BSE_NO_ERROR))) {
    BinarySink_put_byte(buf_o->binarysink_,uVar1);
  }
  if (((src->binarysource_->err == BSE_NO_ERROR) &&
      (uVar1 = BinarySource_get_byte(src->binarysource_), uVar1 != '\r')) &&
     ((uVar1 != '\n' && (src->binarysource_->err == BSE_NO_ERROR)))) {
    src->pos = src->pos - 1;
  }
  pcVar2 = strbuf_to_str(buf_o);
  return pcVar2;
}

Assistant:

static char *read_body(BinarySource *src)
{
    strbuf *buf = strbuf_new_nm();

    while (1) {
        int c = get_byte(src);
        if (c == '\r' || c == '\n' || get_err(src)) {
            if (!get_err(src)) {
                c = get_byte(src);
                if (c != '\r' && c != '\n' && !get_err(src))
                    src->pos--;
            }
            return strbuf_to_str(buf);
        }
        put_byte(buf, c);
    }
}